

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void lengthFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3_value *pVal;
  int iVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  ulong val;
  Mem *pMVar5;
  
  pVal = *argv;
  bVar3 = "\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05"
          [pVal->flags & 0x1f];
  if (1 < bVar3 - 1) {
    if (bVar3 == 3) {
      pbVar2 = (byte *)sqlite3ValueText(pVal,'\x01');
      if (pbVar2 == (byte *)0x0) {
        return;
      }
      bVar3 = *pbVar2;
      val = 0;
      if (bVar3 != 0) {
        do {
          if (bVar3 < 0xc0) {
            bVar3 = pbVar2[1];
          }
          else {
            bVar3 = pbVar2[1];
          }
          pbVar2 = pbVar2 + 1;
          uVar4 = (int)val + 1;
          val = (ulong)uVar4;
        } while (bVar3 != 0);
        val = (ulong)uVar4;
      }
      pMVar5 = context->pOut;
      goto LAB_0025408b;
    }
    if (bVar3 != 4) {
      pMVar5 = context->pOut;
      if ((pMVar5->flags & 0x2460) == 0) {
        pMVar5->flags = 1;
        return;
      }
      vdbeMemClearExternAndSetNull(pMVar5);
      return;
    }
  }
  iVar1 = sqlite3ValueBytes(pVal,'\x01');
  pMVar5 = context->pOut;
  val = (ulong)iVar1;
LAB_0025408b:
  if ((pMVar5->flags & 0x2460) == 0) {
    (pMVar5->u).i = val;
    pMVar5->flags = 4;
    return;
  }
  vdbeReleaseAndSetInt64(pMVar5,val);
  return;
}

Assistant:

static void lengthFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int len;

  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_BLOB:
    case SQLITE_INTEGER:
    case SQLITE_FLOAT: {
      sqlite3_result_int(context, sqlite3_value_bytes(argv[0]));
      break;
    }
    case SQLITE_TEXT: {
      const unsigned char *z = sqlite3_value_text(argv[0]);
      if( z==0 ) return;
      len = 0;
      while( *z ){
        len++;
        SQLITE_SKIP_UTF8(z);
      }
      sqlite3_result_int(context, len);
      break;
    }
    default: {
      sqlite3_result_null(context);
      break;
    }
  }
}